

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextOutput::beginStep(AspifTextOutput *this)

{
  ostream *poVar1;
  size_type sVar2;
  TheoryData *in_RDI;
  
  if (-1 < *(int *)&in_RDI[4].data_) {
    if (*(int *)&in_RDI[4].data_ == 0) {
      std::operator<<((ostream *)in_RDI[1].data_,"% #program base.\n");
    }
    else {
      poVar1 = std::operator<<((ostream *)in_RDI[1].data_,"% #program step(");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&in_RDI[4].data_);
      std::operator<<(poVar1,").\n");
      TheoryData::update(in_RDI);
    }
    *(int *)&in_RDI[4].data_ = *(int *)&in_RDI[4].data_ + 1;
    sVar2 = std::
            vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
            ::size((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                    *)&((in_RDI[3].data_)->frame).elem);
    *(int *)&in_RDI[5].data_ = (int)sVar2;
  }
  return;
}

Assistant:

void AspifTextOutput::beginStep() {
	if (step_ >= 0) {
		if (step_) { os_ << "% #program step(" << step_ << ").\n"; theory_.update(); }
		else       { os_ << "% #program base.\n"; }
		++step_;
		startAtom_ = data_->atoms.size();
	}
}